

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::integer_parser<int>(string *text,int *value)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  reference pcVar5;
  uint *in_RSI;
  undefined8 in_RDI;
  US next;
  US digit;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  US result;
  string *value_match;
  uint8_t base;
  bool negative;
  bool is_signed;
  IntegerDesc int_desc;
  string *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff50;
  int local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 *local_90;
  uint local_84;
  undefined1 *local_80;
  byte local_73;
  byte local_72;
  undefined1 local_71;
  undefined1 auStack_30 [32];
  uint *local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  parser_tool::SplitInteger((string *)int_desc.negative._0_8_);
  local_71 = 1;
  lVar4 = std::__cxx11::string::length();
  local_72 = lVar4 != 0;
  lVar4 = std::__cxx11::string::length();
  local_73 = 10;
  if (lVar4 != 0) {
    local_73 = 0x10;
  }
  local_90 = auStack_30;
  local_84 = 0;
  local_80 = local_90;
  local_98._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff38), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_98);
    cVar1 = *pcVar5;
    local_a8 = 0;
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((local_73 == 0x10) && (('`' < cVar1 && (cVar1 < 'g')))) {
        local_a8 = cVar1 + -0x57;
      }
      else if ((local_73 == 0x10) && (('@' < cVar1 && (cVar1 < 'G')))) {
        local_a8 = cVar1 + -0x37;
      }
      else {
        throw_or_mimic<cxxopts::argument_incorrect_type>(in_stack_ffffffffffffff50);
      }
    }
    else {
      local_a8 = cVar1 + -0x30;
    }
    uVar3 = local_84 * local_73 + local_a8;
    if (uVar3 < local_84) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(in_stack_ffffffffffffff50);
    }
    local_84 = uVar3;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_98);
  }
  detail::check_signed_range<int,unsigned_int>
            (SUB41((uint)in_stack_ffffffffffffff44 >> 0x18,0),in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  if ((local_72 & 1) == 0) {
    *local_10 = local_84;
  }
  else {
    checked_negate<int,unsigned_int&>(local_10,&local_84,local_8);
  }
  parser_tool::IntegerDesc::~IntegerDesc
            ((IntegerDesc *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return;
}

Assistant:

void
    integer_parser(const std::string& text, T& value)
    {
      parser_tool::IntegerDesc int_desc = parser_tool::SplitInteger(text);

      using US = typename std::make_unsigned<T>::type;
      constexpr bool is_signed = std::numeric_limits<T>::is_signed;

      const bool          negative    = int_desc.negative.length() > 0;
      const uint8_t       base        = int_desc.base.length() > 0 ? 16 : 10;
      const std::string & value_match = int_desc.value;

      US result = 0;

      for (char ch : value_match)
      {
        US digit = 0;

        if (ch >= '0' && ch <= '9')
        {
          digit = static_cast<US>(ch - '0');
        }
        else if (base == 16 && ch >= 'a' && ch <= 'f')
        {
          digit = static_cast<US>(ch - 'a' + 10);
        }
        else if (base == 16 && ch >= 'A' && ch <= 'F')
        {
          digit = static_cast<US>(ch - 'A' + 10);
        }
        else
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        const US next = static_cast<US>(result * base + digit);
        if (result > next)
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        result = next;
      }

      detail::check_signed_range<T>(negative, result, text);

      if (negative)
      {
        checked_negate<T>(value, result, text, std::integral_constant<bool, is_signed>());
      }
      else
      {
        value = static_cast<T>(result);
      }
    }